

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O2

bool __thiscall Shell::TermAlgebra::emptyDomain(TermAlgebra *this)

{
  bool bVar1;
  TermAlgebraConstructor **ppTVar2;
  uint i;
  ulong n;
  bool bVar3;
  
  if (this->_n == 0) {
    bVar3 = true;
  }
  else if (this->_allowsCyclicTerms == false) {
    n = 0;
    do {
      bVar3 = this->_n <= n;
      if (bVar3) {
        return bVar3;
      }
      ppTVar2 = Lib::Array<Shell::TermAlgebraConstructor_*>::operator[](&this->_constrs,n);
      bVar1 = TermAlgebraConstructor::recursive(*ppTVar2);
      n = n + 1;
    } while (bVar1);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool TermAlgebra::emptyDomain()
{
  if (_n == 0) {
    return true;
  }

  if (_allowsCyclicTerms) {
    return false;
  }

  for (unsigned i = 0; i < _n; i++) {
    if (!(_constrs[i]->recursive())) {
      return false;
    }
  }
  return true;
}